

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_cargo_zero_start_one_option_no_args(void)

{
  int iVar1;
  uint uVar2;
  char *local_38;
  char *args [1];
  cargo_t pcStack_28;
  int b;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init(&stack0xffffffffffffffd8,0,"program");
  if (iVar1 == 0) {
    args[0]._4_4_ = 0;
    local_38 = "--beta";
    uVar2 = cargo_add_option(pcStack_28,0,"--beta",(char *)0x0,"i",(long)args + 4);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse(pcStack_28,0,0,1,&local_38);
      printf("ret == %d\n",(ulong)cargo._4_4_);
      if (cargo._4_4_ == 0xfffffffc) {
        if (args[0]._4_4_ != 0) {
          pcStack_18 = "Expected b == 0";
        }
      }
      else {
        pcStack_18 = "Parse should fail";
      }
    }
    else {
      pcStack_18 = "Failed to add option";
    }
    cargo_destroy(&stack0xffffffffffffffd8);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_cargo_zero_start_one_option_no_args)
{
    int b = 0;
    char *args[] = { "--beta" };

    ret |= cargo_add_option(cargo, 0, "--beta", NULL, "i", &b);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 0, sizeof(args) / sizeof(args[0]), args);
    printf("ret == %d\n", ret);
    cargo_assert(ret == CARGO_PARSE_MISS_REQUIRED, "Parse should fail");
    cargo_assert(b == 0, "Expected b == 0");

    _TEST_CLEANUP();
}